

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O1

void beltWBLStepE(void *buf,size_t count,void *state)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  belt_wbl_st *st;
  ulong uVar4;
  ulong uVar5;
  
  *(undefined8 *)((long)state + 0x40) = 0;
  if (count < 0x40 || (count & 0xf) != 0) {
    beltWBLStepEBase(buf,count,state);
    return;
  }
  *(undefined8 *)((long)state + 0x30) = *buf;
  uVar2 = *(ulong *)((long)buf + 8);
  *(ulong *)((long)state + 0x38) = uVar2;
  if (0x20 < count) {
    uVar3 = *(ulong *)((long)state + 0x30);
    uVar4 = 0x20;
    do {
      uVar3 = uVar3 ^ *(ulong *)((long)buf + (uVar4 - 0x10));
      *(ulong *)((long)state + 0x30) = uVar3;
      uVar2 = uVar2 ^ *(ulong *)((long)buf + (uVar4 - 8));
      *(ulong *)((long)state + 0x38) = uVar2;
      uVar4 = uVar4 + 0x10;
    } while (uVar4 < count);
  }
  uVar2 = 0;
  do {
    *(undefined8 *)((long)state + 0x20) = *(undefined8 *)((long)state + 0x30);
    *(undefined8 *)((long)state + 0x28) = *(undefined8 *)((long)state + 0x38);
    beltBlockEncr((octet *)((long)state + 0x20),(u32 *)state);
    *(long *)((long)state + 0x40) = *(long *)((long)state + 0x40) + 1;
    memXor2((octet *)((long)state + 0x20),(void *)((long)state + 0x40),8);
    uVar4 = ((count - 0x10) + uVar2) % count;
    *(ulong *)((long)buf + uVar4) = *(ulong *)((long)buf + uVar4) ^ *(ulong *)((long)state + 0x20);
    puVar1 = (ulong *)((long)buf + uVar4 + 8);
    *puVar1 = *puVar1 ^ *(ulong *)((long)state + 0x28);
    uVar3 = *(ulong *)((long)state + 0x30);
    *(ulong *)((long)state + 0x20) = uVar3;
    *(ulong *)((long)state + 0x28) = *(ulong *)((long)state + 0x38);
    uVar5 = *(ulong *)((long)buf + uVar4) ^ uVar3;
    *(ulong *)((long)state + 0x30) = uVar5;
    uVar4 = *(ulong *)((long)state + 0x38) ^ *(ulong *)((long)buf + uVar4 + 8);
    *(ulong *)((long)state + 0x38) = uVar4;
    *(ulong *)((long)state + 0x30) = uVar5 ^ *(ulong *)((long)buf + uVar2);
    *(ulong *)((long)state + 0x38) = uVar4 ^ *(ulong *)((long)buf + uVar2 + 8);
    *(ulong *)((long)buf + uVar2) = uVar3;
    *(undefined8 *)((long)buf + uVar2 + 8) = *(undefined8 *)((long)state + 0x28);
    uVar2 = (uVar2 + 0x10) % count;
  } while (*(ulong *)((long)state + 0x40) % (count + 0xf >> 3 & 0xfffffffffffffffe) != 0);
  return;
}

Assistant:

void beltWBLStepE(void* buf, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	ASSERT(memIsValid(state, beltWBL_keep()));
	st->round = 0;
	(count % 16 || count < 64) ? 
		beltWBLStepEBase(buf, count, state) :
		beltWBLStepEOpt(buf, count, state);
}